

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::St___13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul,27ul,28ul,29ul,30ul,31ul,32ul>
               (FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_> *message,int tag,Visitor *visitor)

{
  bool bVar1;
  size_t sStack_20;
  
  bVar1 = false;
  switch(tag) {
  case 0x10d:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()(visitor,message);
    sStack_20 = 0;
    break;
  case 0x10e:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()(visitor,(FieldRef<Fixpp::TagT<270U,_Fixpp::Type::Float>_> *)(message + 1))
    ;
    sStack_20 = 1;
    break;
  case 0x10f:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()(visitor,(FieldRef<Fixpp::TagT<271U,_Fixpp::Type::Float>_> *)(message + 3))
    ;
    sStack_20 = 3;
    break;
  case 0x110:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<272U,_Fixpp::Type::UTCDate>_> *)(message + 4));
    sStack_20 = 4;
    break;
  case 0x111:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<273U,_Fixpp::Type::UTCTimeOnly>_> *)(message + 5));
    sStack_20 = 5;
    break;
  case 0x112:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()(visitor,(FieldRef<Fixpp::TagT<274U,_Fixpp::Type::Char>_> *)(message + 6));
    sStack_20 = 6;
    break;
  case 0x113:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<275U,_Fixpp::Type::String>_> *)(message + 7));
    sStack_20 = 7;
    break;
  case 0x114:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<276U,_Fixpp::Type::String>_> *)(message + 10));
    sStack_20 = 10;
    break;
  case 0x115:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<277U,_Fixpp::Type::String>_> *)(message + 0xb));
    sStack_20 = 0xb;
    break;
  case 0x116:
  case 0x117:
  case 0x118:
  case 0x119:
  case 0x11d:
  case 0x122:
  case 0x123:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 0x12a:
    goto switchD_00a985aa_caseD_116;
  case 0x11a:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<282U,_Fixpp::Type::String>_> *)(message + 0xc));
    sStack_20 = 0xc;
    break;
  case 0x11b:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<283U,_Fixpp::Type::String>_> *)(message + 0xd));
    sStack_20 = 0xd;
    break;
  case 0x11c:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<284U,_Fixpp::Type::String>_> *)(message + 0xe));
    sStack_20 = 0xe;
    break;
  case 0x11e:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<286U,_Fixpp::Type::Char>_> *)(message + 0xf));
    sStack_20 = 0xf;
    break;
  case 0x11f:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<287U,_Fixpp::Type::Int>_> *)(message + 0x15));
    sStack_20 = 0x15;
    break;
  case 0x120:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<288U,_Fixpp::Type::String>_> *)(message + 0x18));
    sStack_20 = 0x18;
    break;
  case 0x121:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<289U,_Fixpp::Type::String>_> *)(message + 0x19));
    sStack_20 = 0x19;
    break;
  case 299:
    FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
    ::Visitor::operator()
              (visitor,(FieldRef<Fixpp::TagT<299U,_Fixpp::Type::String>_> *)(message + 0x17));
    sStack_20 = 0x17;
    break;
  default:
    if (tag == 0xf) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_> *)(message + 2));
      sStack_20 = 2;
    }
    else if (tag == 0x12) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<18U,_Fixpp::Type::String>_> *)(message + 0x14));
      sStack_20 = 0x14;
    }
    else if (tag == 0x25) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<37U,_Fixpp::Type::String>_> *)(message + 0x16));
      sStack_20 = 0x16;
    }
    else if (tag == 0x3a) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_> *)(message + 0x1d));
      sStack_20 = 0x1d;
    }
    else if (tag == 0x3b) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<59U,_Fixpp::Type::Char>_> *)(message + 0x10));
      sStack_20 = 0x10;
    }
    else if (tag == 0x6e) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<110U,_Fixpp::Type::Float>_> *)(message + 0x13));
      sStack_20 = 0x13;
    }
    else if (tag == 0x7e) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<126U,_Fixpp::Type::UTCTimestamp>_> *)(message + 0x12)
                );
      sStack_20 = 0x12;
    }
    else if (tag == 0x150) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_> *)(message + 8));
      sStack_20 = 8;
    }
    else if (tag == 0x15a) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<346U,_Fixpp::Type::Int>_> *)(message + 0x1a));
      sStack_20 = 0x1a;
    }
    else if (tag == 0x162) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_> *)(message + 0x1e));
      sStack_20 = 0x1e;
    }
    else if (tag == 0x163) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_> *)(message + 0x1f));
      sStack_20 = 0x1f;
    }
    else if (tag == 0x1b0) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<432U,_Fixpp::Type::String>_> *)(message + 0x11));
      sStack_20 = 0x11;
    }
    else if (tag == 0x222) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<546U,_Fixpp::Type::String>_> *)(message + 0x1b));
      sStack_20 = 0x1b;
    }
    else if (tag == 0x271) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<625U,_Fixpp::Type::String>_> *)(message + 9));
      sStack_20 = 9;
    }
    else if (tag == 0x32b) {
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<811U,_Fixpp::Type::Float>_> *)(message + 0x1c));
      sStack_20 = 0x1c;
    }
    else {
      if (tag != 0x2367) {
        return false;
      }
      FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<269u,Fixpp::Type::Char>>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<273u,Fixpp::Type::UTCTimeOnly>,Fixpp::TagT<274u,Fixpp::Type::Char>,Fixpp::TagT<275u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<625u,Fixpp::Type::String>,Fixpp::TagT<276u,Fixpp::Type::String>,Fixpp::TagT<277u,Fixpp::Type::String>,Fixpp::TagT<282u,Fixpp::Type::String>,Fixpp::TagT<283u,Fixpp::Type::String>,Fixpp::TagT<284u,Fixpp::Type::String>,Fixpp::TagT<286u,Fixpp::Type::Char>,Fixpp::TagT<59u,Fixpp::Type::Char>,Fixpp::TagT<432u,Fixpp::Type::String>,Fixpp::TagT<126u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<110u,Fixpp::Type::Float>,Fixpp::TagT<18u,Fixpp::Type::String>,Fixpp::TagT<287u,Fixpp::Type::Int>,Fixpp::TagT<37u,Fixpp::Type::String>,Fixpp::TagT<299u,Fixpp::Type::String>,Fixpp::TagT<288u,Fixpp::Type::String>,Fixpp::TagT<289u,Fixpp::Type::String>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<546u,Fixpp::Type::String>,Fixpp::TagT<811u,Fixpp::Type::Float>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<9063u,Fixpp::Type::String>>>>
      ::Visitor::operator()
                (visitor,(FieldRef<Fixpp::TagT<9063U,_Fixpp::Type::String>_> *)(message + 0x20));
      sStack_20 = 0x20;
    }
  }
  std::bitset<33UL>::set((bitset<33UL> *)&message[0x21].m_view.second,sStack_20,true);
  bVar1 = true;
switchD_00a985aa_caseD_116:
  return bVar1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }